

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3FilterMethod(sqlite3_vtab_cursor *pCursor,int idxNum,char *idxStr,int nVal,
                    sqlite3_value **apVal)

{
  byte bVar1;
  byte bVar2;
  sqlite3_vtab *psVar3;
  Fts3Cursor *pCsr;
  Fts3TokenAndCost *pFVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  sqlite3_vtab *psVar9;
  sqlite3_value *psVar10;
  i64 iVar11;
  size_t sVar12;
  Fts3Expr *pFVar13;
  void *pvVar14;
  Fts3Expr *pFVar15;
  Fts3Expr *pFVar16;
  sqlite3_tokenizer_module *psVar17;
  char *pcVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  sqlite3_value *psVar23;
  Fts3Phrase *pFVar24;
  Fts3TokenAndCost *pFVar25;
  ulong uVar26;
  uchar uVar27;
  uchar uVar28;
  sqlite3_tokenizer_module *psVar29;
  sqlite3_vtab_cursor *pp;
  Fts3Expr **__dest;
  sqlite3_value *__s1;
  long lVar30;
  bool bVar31;
  undefined1 uVar32;
  bool bVar33;
  int nToken;
  int iEnd;
  sqlite3_tokenizer_cursor *pCursor_1;
  char *zByte;
  uint local_138;
  char local_131;
  Fts3Expr *local_130;
  void *local_128;
  uint local_11c;
  undefined8 local_118;
  Fts3Expr *local_110;
  uint local_104;
  sqlite3_value *local_100;
  sqlite3_vtab_cursor *local_f8;
  sqlite3_tokenizer_module *local_f0;
  uint local_e8;
  int local_e4;
  ulong local_e0;
  Fts3Cursor *local_d8;
  sqlite3_value *local_d0;
  uint local_c4;
  long local_c0;
  Fts3Expr *local_b8;
  Fts3Expr *local_b0;
  sqlite3_tokenizer_module *local_a8;
  Fts3TokenAndCost *local_a0;
  sqlite3_value *local_98;
  sqlite3_tokenizer_module *local_90;
  ulong local_88;
  sqlite3_module *local_80;
  sqlite3_vtab *local_78;
  sqlite3_value *local_70;
  sqlite3_value *local_68;
  uint local_5c;
  i64 local_58;
  char **local_50;
  ulong local_48;
  char *local_40;
  long local_38;
  
  local_e8 = idxNum & 0xffff;
  if (local_e8 == 0) {
    local_98 = (sqlite3_value *)0x0;
  }
  else {
    local_98 = *apVal;
  }
  uVar8 = (uint)(local_e8 != 0);
  if (((uint)idxNum >> 0x10 & 1) == 0) {
    local_100 = (sqlite3_value *)0x0;
  }
  else {
    uVar26 = (ulong)uVar8;
    uVar8 = uVar8 + 1;
    local_100 = apVal[uVar26];
  }
  if (((uint)idxNum >> 0x11 & 1) == 0) {
    local_70 = (sqlite3_value *)0x0;
  }
  else {
    uVar26 = (ulong)uVar8;
    uVar8 = uVar8 + 1;
    local_70 = apVal[uVar26];
  }
  if (((uint)idxNum >> 0x12 & 1) == 0) {
    psVar10 = (sqlite3_value *)0x0;
  }
  else {
    psVar10 = apVal[uVar8];
  }
  psVar3 = pCursor->pVtab;
  fts3ClearCursor((Fts3Cursor *)pCursor);
  psVar9 = (sqlite3_vtab *)fts3DocidRange(local_70,-0x8000000000000000);
  pCursor[0xc].pVtab = psVar9;
  local_68 = psVar10;
  psVar9 = (sqlite3_vtab *)fts3DocidRange(psVar10,0x7fffffffffffffff);
  pCursor[0xd].pVtab = psVar9;
  if (idxStr == (char *)0x0) {
    uVar32 = *(undefined1 *)((long)&psVar3[0x12].zErrMsg + 7);
  }
  else {
    uVar32 = *idxStr == 'D';
  }
  *(undefined1 *)((long)&pCursor[9].pVtab + 4) = uVar32;
  *(short *)&pCursor[1].pVtab = (short)idxNum;
  psVar10 = local_68;
  local_78 = psVar3;
  if (1 < local_e8) {
    psVar10 = (sqlite3_value *)sqlite3ValueText(local_98,'\x01');
    if ((psVar10 == (sqlite3_value *)0x0) &&
       (uVar8._0_2_ = local_98->flags, uVar8._2_1_ = local_98->enc, uVar8._3_1_ = local_98->eSubtype
       , (0xaaaaaaaaU >> (uVar8 & 0x1f) & 1) == 0)) {
      return 7;
    }
    *(undefined4 *)&pCursor[4].pVtab = 0;
    if (local_100 == (Mem *)0x0) {
      iVar11 = 0;
    }
    else {
      iVar11 = sqlite3VdbeIntValue(local_100);
      *(int *)&pCursor[4].pVtab = (int)iVar11;
    }
    local_d8 = (Fts3Cursor *)pCursor;
    local_5c = idxNum;
    if (psVar10 == (sqlite3_value *)0x0) {
      pCursor[3].pVtab = (sqlite3_vtab *)0x0;
LAB_001b98e9:
      pFVar13 = (Fts3Expr *)0x0;
    }
    else {
      local_e8 = local_e8 - 2;
      local_50 = &local_78->zErrMsg;
      local_38 = *(long *)&local_78[2].nRef;
      local_80 = local_78[3].pModule;
      local_48 = (ulong)*(uint *)&local_78[2].pModule;
      local_131 = *(char *)((long)&local_78[0x12].zErrMsg + 4);
      local_58 = iVar11;
      sVar12 = strlen((char *)psVar10);
      local_c4 = 1;
      local_b8 = (Fts3Expr *)0x0;
      local_b0 = (Fts3Expr *)0x0;
      pFVar13 = (Fts3Expr *)0x0;
      psVar23 = psVar10;
      local_f8 = pCursor + 3;
      do {
        uVar8 = (uint)sVar12;
        uVar26 = sVar12 & 0xffffffff;
        __s1 = psVar10;
        local_100 = psVar10;
        local_e0 = sVar12;
        if ((int)uVar8 < 1) {
          if (uVar8 == 0) {
LAB_001b986c:
            iVar6 = 0x65;
            pp = local_f8;
            break;
          }
        }
        else {
          while( true ) {
            uVar8 = (uint)uVar26;
            if ((4 < *(byte *)&__s1->u - 9) && (*(byte *)&__s1->u != 0x20)) break;
            uVar26 = (ulong)(uVar8 - 1);
            __s1 = (sqlite3_value *)((long)&__s1->u + 1);
            if ((int)uVar8 < 2) goto LAB_001b986c;
          }
        }
        local_c0 = (long)__s1 - (long)psVar10;
        local_130 = (Fts3Expr *)0x0;
        local_128 = (void *)0x0;
        lVar30 = 0;
        local_110 = pFVar13;
        local_d0 = psVar23;
        do {
          lVar21 = lVar30 * 0x10;
          if ((&DAT_0020d9e9)[lVar21] == '\0') {
            uVar26 = (ulong)(byte)(&DAT_0020d9e8)[lVar21];
            if (((int)(uint)(byte)(&DAT_0020d9e8)[lVar21] <= (int)uVar8) &&
               (iVar6 = bcmp(__s1,(void *)(&getNextNode_aKeyword)[lVar30 * 2],uVar26),
               psVar10 = local_100, iVar6 == 0)) {
              bVar1 = (&DAT_0020d9ea)[lVar21];
              iVar6 = 10;
              if ((bVar1 == 1) &&
                 ((*(char *)((long)&__s1->u + 4) == '/' &&
                  (cVar5 = *(char *)((long)&__s1->u + 5), (byte)(cVar5 - 0x30U) < 10)))) {
                iVar6 = 0;
                lVar21 = 6;
                do {
                  iVar6 = (uint)(byte)(cVar5 - 0x30) + iVar6 * 10;
                  cVar5 = *(char *)((long)&__s1->u + lVar21);
                  lVar21 = lVar21 + 1;
                } while ((byte)(cVar5 - 0x30U) < 10);
                uVar26 = (ulong)((int)lVar21 - 1);
              }
              bVar2 = *(byte *)((long)&__s1->u + uVar26);
              uVar22 = (ulong)bVar2;
              if (uVar22 < 0x2a) {
                if ((0x30400000001U >> (uVar22 & 0x3f) & 1) != 0) {
                  local_118._0_4_ = (uint)bVar1;
                  pFVar13 = (Fts3Expr *)fts3MallocZero(0x40);
                  if (pFVar13 == (Fts3Expr *)0x0) {
                    local_118 = CONCAT44(local_118._4_4_,7);
                  }
                  else {
                    pFVar13->eType = (uint)local_118;
                    pFVar13->nNear = iVar6;
                    local_118 = (ulong)local_118._4_4_ << 0x20;
                    local_128 = (void *)(ulong)(uint)((int)uVar26 + (int)local_c0);
                    local_130 = pFVar13;
                  }
                  goto LAB_001b8df4;
                }
                if ((0x100003e00U >> (uVar22 & 0x3f) & 1) == 0) goto LAB_001b8df4;
                pFVar13 = (Fts3Expr *)fts3MallocZero(0x40);
                if (pFVar13 == (Fts3Expr *)0x0) {
                  iVar6 = 7;
                  psVar23 = local_d0;
                  pp = local_f8;
                  pCursor = &local_d8->base;
                  pFVar13 = local_110;
                  goto LAB_001b9876;
                }
                pFVar13->eType = (uint)bVar1;
                pFVar13->nNear = iVar6;
                local_128 = (void *)(ulong)(uint)((int)uVar26 + (int)local_c0);
                local_118 = local_118 & 0xffffffff00000000;
                local_130 = pFVar13;
              }
              else {
LAB_001b8df4:
                psVar10 = local_100;
                pFVar13 = local_110;
                if ((0x29 < bVar2) || ((0x30400000001U >> ((ulong)(uint)bVar2 & 0x3f) & 1) == 0))
                goto LAB_001b8e2b;
              }
              bVar31 = true;
              iVar7 = (int)local_e0;
              psVar23 = local_d0;
              pp = local_f8;
              pFVar13 = local_110;
              goto LAB_001b961b;
            }
          }
LAB_001b8e2b:
          lVar21 = local_38;
          psVar23 = local_d0;
          lVar30 = lVar30 + 1;
        } while (lVar30 != 4);
        if (*(char *)&__s1->u == '\"') {
          uVar26 = 1;
          if (1 < (int)uVar8) {
            uVar26 = 1;
            while (*(char *)((long)&__s1->u + uVar26) != '\"') {
              uVar26 = uVar26 + 1;
              if (uVar8 == uVar26) goto LAB_001b9c85;
            }
          }
          uVar19 = (uint)uVar26;
          if (uVar19 == uVar8) {
LAB_001b9c85:
            iVar6 = 1;
            pp = local_f8;
            pCursor = &local_d8->base;
            break;
          }
          pcVar18 = (char *)((long)&__s1->u + 1);
          local_f0 = *(sqlite3_tokenizer_module **)&local_80->iVersion;
          local_a8 = (sqlite3_tokenizer_module *)0x0;
          iVar6 = sqlite3Fts3OpenTokenizer
                            ((sqlite3_tokenizer *)local_80,(int)local_58,pcVar18,uVar19 - 1,
                             (sqlite3_tokenizer_cursor **)&local_a8);
          psVar17 = local_f0;
          if (iVar6 == 0) {
            local_118 = CONCAT44(local_118._4_4_,uVar19 - 1);
            uVar8 = 0;
            local_138 = 0;
            local_104 = 0;
            local_11c = 0;
            local_e4 = 0;
            local_90 = local_a8;
            local_40 = pcVar18;
            iVar6 = (*local_f0->xNext)((sqlite3_tokenizer_cursor *)local_a8,(char **)&local_a0,
                                       (int *)&local_138,(int *)&local_104,(int *)&local_11c,
                                       &local_e4);
            if (iVar6 == 0) {
              local_88 = 0;
              lVar30 = 0xc0;
              pFVar15 = (Fts3Expr *)0x0;
              local_128 = (void *)0x0;
              iVar6 = 0;
              do {
                local_130 = (Fts3Expr *)fts3ReallocOrFree(pFVar15,lVar30);
                pvVar14 = local_128;
                if (local_130 == (Fts3Expr *)0x0) {
LAB_001b95b0:
                  iVar7 = (int)local_e0;
                  psVar23 = local_d0;
                  psVar29 = local_90;
                  psVar17 = local_f0;
                  goto LAB_001b95cc;
                }
                pvVar14 = fts3ReallocOrFree(local_128,(long)(int)local_138 + (long)iVar6);
                pFVar16 = local_130;
                if (pvVar14 == (void *)0x0) {
                  pvVar14 = (void *)0x0;
                  pFVar13 = local_110;
                  goto LAB_001b95b0;
                }
                pcVar18 = (char *)((long)local_130 + lVar30 + -0x18);
                pcVar18[0] = '\0';
                pcVar18[1] = '\0';
                pcVar18[2] = '\0';
                pcVar18[3] = '\0';
                pcVar18[4] = '\0';
                pcVar18[5] = '\0';
                pcVar18[6] = '\0';
                pcVar18[7] = '\0';
                pcVar18[8] = '\0';
                pcVar18[9] = '\0';
                pcVar18[10] = '\0';
                pcVar18[0xb] = '\0';
                pcVar18[0xc] = '\0';
                pcVar18[0xd] = '\0';
                pcVar18[0xe] = '\0';
                pcVar18[0xf] = '\0';
                pcVar18 = (char *)((long)local_130 + lVar30 + -0x28);
                pcVar18[0] = '\0';
                pcVar18[1] = '\0';
                pcVar18[2] = '\0';
                pcVar18[3] = '\0';
                pcVar18[4] = '\0';
                pcVar18[5] = '\0';
                pcVar18[6] = '\0';
                pcVar18[7] = '\0';
                pcVar18[8] = '\0';
                pcVar18[9] = '\0';
                pcVar18[10] = '\0';
                pcVar18[0xb] = '\0';
                pcVar18[0xc] = '\0';
                pcVar18[0xd] = '\0';
                pcVar18[0xe] = '\0';
                pcVar18[0xf] = '\0';
                pcVar18 = (char *)((long)local_130 + lVar30 + -8);
                pcVar18[0] = '\0';
                pcVar18[1] = '\0';
                pcVar18[2] = '\0';
                pcVar18[3] = '\0';
                pcVar18[4] = '\0';
                pcVar18[5] = '\0';
                pcVar18[6] = '\0';
                pcVar18[7] = '\0';
                local_128 = pvVar14;
                memcpy((void *)((long)iVar6 + (long)pvVar14),local_a0,(long)(int)local_138);
                pFVar13 = local_110;
                pFVar15 = local_130;
                *(uint *)((long)pFVar16 + lVar30 + -0x20) = local_138;
                uVar8 = 0;
                uVar20 = 0;
                if ((int)local_11c < (int)(uint)local_118) {
                  uVar20 = (uint)(local_40[(int)local_11c] == '*');
                }
                *(uint *)((long)local_130 + lVar30 + -0x1c) = uVar20;
                if (0 < (long)(int)local_104) {
                  uVar8 = (uint)(*(char *)((long)&__s1->u + (long)(int)local_104) == '^');
                }
                iVar6 = iVar6 + local_138;
                *(uint *)((long)local_130 + lVar30 + -0x18) = uVar8;
                local_138 = 0;
                local_104 = 0;
                local_11c = 0;
                local_e4 = 0;
                iVar7 = (*local_f0->xNext)((sqlite3_tokenizer_cursor *)local_90,(char **)&local_a0,
                                           (int *)&local_138,(int *)&local_104,(int *)&local_11c,
                                           &local_e4);
                uVar8 = (int)local_88 + 1;
                local_88 = (ulong)uVar8;
                lVar30 = lVar30 + 0x28;
              } while (iVar7 == 0);
              local_118 = CONCAT44(local_118._4_4_,iVar7);
              sVar12 = (size_t)iVar6;
              psVar23 = local_d0;
              psVar17 = local_f0;
            }
            else {
              local_118 = CONCAT44(local_118._4_4_,iVar6);
              sVar12 = 0;
              local_128 = (void *)0x0;
              local_130 = (Fts3Expr *)0x0;
            }
            (*psVar17->xClose)((sqlite3_tokenizer_cursor *)local_90);
            local_a8 = (sqlite3_tokenizer_module *)0x0;
            iVar6 = (uint)local_118;
          }
          else {
            local_130 = (Fts3Expr *)0x0;
            local_128 = (void *)0x0;
            sVar12 = 0;
            uVar8 = 0;
          }
          if (iVar6 == 0x65) {
            local_118 = sVar12;
            pFVar15 = (Fts3Expr *)
                      fts3ReallocOrFree(local_130,sVar12 + (long)(int)uVar8 * 0x28 + 0xc0);
            if (pFVar15 == (Fts3Expr *)0x0) {
              local_130 = (Fts3Expr *)0x0;
              iVar7 = (int)local_e0;
              pvVar14 = local_128;
              psVar29 = local_a8;
              pFVar13 = local_110;
LAB_001b95cc:
              pp = local_f8;
              if (psVar29 != (sqlite3_tokenizer_module *)0x0) {
                local_128 = pvVar14;
                (*psVar17->xClose)((sqlite3_tokenizer_cursor *)psVar29);
                pvVar14 = local_128;
              }
              sqlite3_free(pvVar14);
              sqlite3_free(local_130);
              local_118 = CONCAT44(local_118._4_4_,7);
              local_130 = (Fts3Expr *)0x0;
            }
            else {
              pFVar24 = (Fts3Phrase *)(pFVar15 + 1);
              memset(pFVar15,0,0x90);
              pvVar14 = local_128;
              pFVar15->eType = 5;
              pFVar15->pPhrase = pFVar24;
              *(uint *)((long)&pFVar15[2].pLeft + 4) = local_e8;
              *(uint *)&pFVar15[2].pLeft = uVar8;
              __dest = &pFVar15[2].pRight + (long)(int)uVar8 * 5;
              if (local_128 != (void *)0x0) {
                memcpy(__dest,local_128,local_118);
                sqlite3_free(pvVar14);
                pFVar24 = pFVar15->pPhrase;
              }
              iVar6 = pFVar24->nToken;
              local_118 = local_118 & 0xffffffff00000000;
              psVar23 = local_d0;
              pFVar13 = local_110;
              local_130 = pFVar15;
              if ((long)iVar6 < 1) goto LAB_001b9286;
              lVar30 = 0;
              iVar7 = (int)local_e0;
              do {
                *(Fts3Expr ***)((long)&pFVar24->aToken[0].z + lVar30) = __dest;
                __dest = (Fts3Expr **)
                         ((long)__dest + (long)*(int *)((long)&pFVar24->aToken[0].n + lVar30));
                lVar30 = lVar30 + 0x28;
                pp = local_f8;
              } while ((long)iVar6 * 0x28 != lVar30);
            }
          }
          else {
            local_118 = CONCAT44(local_118._4_4_,iVar6);
LAB_001b9286:
            iVar7 = (int)local_e0;
            pp = local_f8;
          }
          local_128 = (void *)(ulong)((int)local_c0 + uVar19 + 1);
          bVar31 = true;
        }
        else {
          iVar6 = 0;
          uVar19 = local_e8;
          if (0 < (int)local_48) {
            uVar26 = 0;
            do {
              pcVar18 = *(char **)(lVar21 + uVar26 * 8);
              sVar12 = strlen(pcVar18);
              iVar6 = (int)sVar12;
              if (((iVar6 < (int)uVar8) && (pcVar18 != (char *)0x0)) &&
                 (*(char *)((long)&__s1->u + (long)iVar6) == ':')) {
                if (0 < iVar6) {
                  uVar19 = iVar6 + 1;
                  lVar30 = 0;
                  while ((ulong)(byte)pcVar18[lVar30] != 0) {
                    uVar27 = ""[(byte)pcVar18[lVar30]];
                    uVar28 = ""[*(byte *)((long)&__s1->u + lVar30)];
                    if (uVar27 != uVar28) goto LAB_001b8f08;
                    uVar19 = uVar19 - 1;
                    lVar30 = lVar30 + 1;
                    if (uVar19 < 2) goto LAB_001b8fb0;
                  }
                  uVar28 = ""[*(byte *)((long)&__s1->u + lVar30)];
                  uVar27 = '\0';
LAB_001b8f08:
                  if (uVar27 != uVar28) goto LAB_001b8f14;
                }
LAB_001b8fb0:
                iVar6 = iVar6 + (int)local_c0 + 1;
                goto LAB_001b8fbf;
              }
LAB_001b8f14:
              uVar26 = uVar26 + 1;
            } while (uVar26 != local_48);
            iVar6 = 0;
            uVar26 = (ulong)local_e8;
LAB_001b8fbf:
            uVar19 = (uint)uVar26;
            psVar10 = local_100;
          }
          psVar23 = local_d0;
          pcVar18 = (char *)((long)&psVar10->u + (long)iVar6);
          lVar30 = *(long *)&local_80->iVersion;
          uVar8 = (int)local_e0 - iVar6;
          local_128 = (void *)0x0;
          if (uVar8 != 0 && iVar6 <= (int)local_e0) {
            local_128 = (void *)0x0;
            do {
              if (pcVar18[(long)local_128] == '\"') goto LAB_001b9004;
              local_128 = (void *)((long)local_128 + 1);
            } while ((void *)(ulong)uVar8 != local_128);
            local_128 = (void *)(ulong)uVar8;
          }
LAB_001b9004:
          iVar7 = sqlite3Fts3OpenTokenizer
                            ((sqlite3_tokenizer *)local_80,(int)local_58,pcVar18,(int)local_128,
                             (sqlite3_tokenizer_cursor **)&local_a8);
          if (iVar7 == 0) {
            local_c0 = CONCAT44(local_c0._4_4_,iVar6);
            local_138 = 0;
            local_104 = 0;
            local_11c = 0;
            local_e4 = 0;
            local_f0 = local_a8;
            iVar6 = (**(code **)(lVar30 + 0x28))
                              ((sqlite3_tokenizer_cursor *)local_a8,(char **)&local_a0,
                               (int *)&local_138,(int *)&local_104,(int *)&local_11c,&local_e4);
            if (iVar6 == 0) {
              local_130 = (Fts3Expr *)fts3MallocZero((long)(int)local_138 + 0xc0);
              if (local_130 == (Fts3Expr *)0x0) {
                local_118 = CONCAT44(local_118._4_4_,7);
                local_128 = (void *)(ulong)local_11c;
                goto LAB_001b90b4;
              }
              local_130->eType = 5;
              local_130->pPhrase = (Fts3Phrase *)(local_130 + 1);
              *(undefined4 *)&local_130[2].pLeft = 1;
              *(uint *)((long)&local_130[2].pLeft + 4) = uVar19;
              *(uint *)&local_130[2].pPhrase = local_138;
              local_130[2].pRight = local_130 + 3;
              memcpy(local_130 + 3,local_a0,(long)(int)local_138);
              local_128 = (void *)(ulong)local_11c;
              if (((int)local_11c < (int)uVar8) && (pcVar18[(int)local_11c] == '*')) {
                *(undefined4 *)((long)&local_130[2].pPhrase + 4) = 1;
                local_11c = local_11c + 1;
                local_128 = (void *)(ulong)local_11c;
              }
              iVar6 = (int)local_c0;
              if ((long)(int)local_104 < 1) {
                local_118 = (ulong)local_118._4_4_ << 0x20;
                bVar31 = true;
              }
              else {
                bVar31 = false;
                lVar21 = (long)(int)local_104;
                do {
                  bVar33 = true;
                  if (pcVar18[lVar21 + -1] != '-') {
                    if ((local_131 == '\0') || (pcVar18[lVar21 + -1] != '^')) break;
                    *(undefined4 *)&local_130[2].iDocid = 1;
                    bVar33 = bVar31;
                  }
                  bVar31 = bVar33;
                  local_104 = (uint)(lVar21 + -1);
                  bVar33 = 1 < lVar21;
                  lVar21 = lVar21 + -1;
                } while (bVar33);
                bVar31 = !bVar31;
                local_118 = (ulong)local_118._4_4_ << 0x20;
              }
            }
            else {
              iVar7 = iVar6;
              if (iVar6 == 0x65) {
                iVar7 = 0;
              }
              if ((int)local_128 == 0) {
                iVar7 = iVar6;
              }
              local_118 = CONCAT44(local_118._4_4_,iVar7);
LAB_001b90b4:
              bVar31 = true;
              local_130 = (Fts3Expr *)0x0;
              iVar6 = (int)local_c0;
            }
            pFVar13 = local_110;
            (**(code **)(lVar30 + 0x20))((sqlite3_tokenizer_cursor *)local_f0);
          }
          else {
            local_118 = CONCAT44(local_118._4_4_,iVar7);
            bVar31 = true;
            local_130 = (Fts3Expr *)0x0;
            pFVar13 = local_110;
          }
          iVar7 = (int)local_e0;
          local_128 = (void *)(ulong)(uint)((int)local_128 + iVar6);
          pp = local_f8;
        }
LAB_001b961b:
        iVar6 = (uint)local_118;
        if (((uint)local_118 == 0) && (local_130 != (Fts3Expr *)0x0)) {
          iVar6 = local_130->eType;
          if (iVar6 == 5) {
            if (bVar31) {
              bVar31 = true;
              bVar33 = false;
LAB_001b969d:
              if (local_c4 != 0 || bVar33 != false) {
                pFVar15 = local_b8;
                if (local_b8 != (Fts3Expr *)0x0) goto LAB_001b96ec;
                pFVar15 = (Fts3Expr *)0x0;
LAB_001b9789:
                pFVar13 = local_130;
                if (bVar31) {
                  if (local_110 != (Fts3Expr *)0x0) {
                    pFVar15->pRight = local_130;
                    local_130->pParent = pFVar15;
                    pFVar13 = local_110;
                  }
                }
                else {
                  do {
                    pFVar16 = pFVar15;
                    pFVar15 = pFVar16->pParent;
                    if (pFVar15 == (Fts3Expr *)0x0) goto LAB_001b97f4;
                  } while ((pFVar15->eType == 1) ||
                          (local_130->eType != 1 && (pFVar15->eType == 4 || local_130->eType != 4)))
                  ;
                  pFVar15->pRight = local_130;
                  local_130->pParent = pFVar15;
                  pFVar13 = local_110;
LAB_001b97f4:
                  local_130->pLeft = pFVar16;
                  pFVar16->pParent = local_130;
                }
                local_c4 = (uint)bVar33;
                local_b8 = local_130;
                iVar6 = 0;
                goto LAB_001b9821;
              }
              pFVar15 = (Fts3Expr *)fts3MallocZero(0x40);
              if (pFVar15 == (Fts3Expr *)0x0) {
                iVar7 = 7;
              }
              else {
                pFVar15->eType = 3;
                pFVar13 = local_b8;
                do {
                  pFVar16 = pFVar13;
                  pFVar13 = pFVar16->pParent;
                } while (pFVar16->pParent != (Fts3Expr *)0x0);
                pFVar15->pLeft = pFVar16;
                pFVar16->pParent = pFVar15;
                local_110 = pFVar15;
LAB_001b96ec:
                if ((!(bool)(iVar6 != 1 | bVar31)) && (pFVar15->eType != 5)) goto LAB_001b9c99;
                if (((bool)(bVar31 ^ 1U | iVar6 == 5)) || (pFVar15->eType != 1)) goto LAB_001b9789;
                iVar7 = 1;
              }
            }
            else {
              pFVar15 = (Fts3Expr *)fts3MallocZero(0x40);
              if (pFVar15 != (Fts3Expr *)0x0) {
                pFVar15->eType = 2;
                pFVar15->pRight = local_130;
                local_130->pParent = pFVar15;
                if (local_b0 != (Fts3Expr *)0x0) {
                  pFVar15->pLeft = local_b0;
                  local_b0->pParent = pFVar15;
                }
                pFVar13 = local_110;
                iVar6 = 0;
                local_b0 = pFVar15;
                goto LAB_001b9821;
              }
              iVar7 = 7;
            }
          }
          else {
            bVar33 = local_130->pLeft == (Fts3Expr *)0x0;
            bVar31 = !bVar33;
            if (!bVar33 || local_c4 == 0) goto LAB_001b969d;
LAB_001b9c99:
            iVar7 = 1;
          }
          pFVar13 = local_110;
          sqlite3Fts3ExprFree(local_130);
          goto LAB_001b997b;
        }
LAB_001b9821:
        sVar12 = (size_t)(uint)(iVar7 - (int)local_128);
        psVar10 = (sqlite3_value *)((long)&local_100->u + (long)(int)local_128);
        pCursor = &local_d8->base;
      } while (iVar6 == 0);
LAB_001b9876:
      iVar7 = 1;
      if (local_c4 == 0) {
        iVar7 = iVar6;
      }
      if (pFVar13 == (Fts3Expr *)0x0) {
        iVar7 = iVar6;
      }
      if (iVar6 != 0x65) {
        iVar7 = iVar6;
      }
      if (iVar7 != 0x65) {
LAB_001b997b:
        sqlite3Fts3ExprFree(pFVar13);
        sqlite3Fts3ExprFree(local_b0);
        pp->pVtab = (sqlite3_vtab *)0x0;
        pFVar13 = (Fts3Expr *)0x0;
LAB_001b99d7:
        sqlite3Fts3ExprFree(pFVar13);
        pp->pVtab = (sqlite3_vtab *)0x0;
        if (iVar7 == 1) {
          sqlite3Fts3ErrMsg(local_50,"malformed MATCH expression: [%s]",psVar23);
        }
        else {
          if (iVar7 != 0x12) {
            return iVar7;
          }
          sqlite3Fts3ErrMsg(local_50,"FTS expression tree is too large (maximum depth %d)",0xc);
        }
        return 1;
      }
      if ((local_b0 == (Fts3Expr *)0x0) || (pFVar15 = local_b0, pFVar13 == (Fts3Expr *)0x0)) {
        iVar7 = 1;
        if (local_b0 != (Fts3Expr *)0x0) goto LAB_001b997b;
      }
      else {
        do {
          pFVar16 = pFVar15;
          pFVar15 = pFVar16->pLeft;
        } while (pFVar16->pLeft != (Fts3Expr *)0x0);
        pFVar16->pLeft = pFVar13;
        pFVar13->pParent = pFVar16;
        pFVar13 = local_b0;
      }
      pp->pVtab = (sqlite3_vtab *)pFVar13;
      if (pFVar13 == (Fts3Expr *)0x0) goto LAB_001b98e9;
      iVar7 = fts3ExprBalance((Fts3Expr **)pp,0xc);
      pFVar13 = (Fts3Expr *)pp->pVtab;
      if ((iVar7 != 0) || (iVar7 = fts3ExprCheckDepth(pFVar13,0xc), iVar7 != 0)) goto LAB_001b99d7;
    }
    psVar3 = (((Fts3Cursor *)pCursor)->base).pVtab;
    local_138 = 0;
    local_104 = 0;
    local_11c = 0;
    fts3EvalAllocateReaders
              ((Fts3Cursor *)pCursor,pFVar13,(int *)&local_104,(int *)&local_11c,(int *)&local_138);
    psVar10 = local_68;
    uVar8 = local_104;
    if ((1 < (int)local_104 && local_138 == 0) &&
       (*(char *)((long)&psVar3[0x12].zErrMsg + 4) != '\0')) {
      lVar30 = (long)(int)local_11c;
      iVar6 = sqlite3_initialize();
      if (iVar6 == 0) {
        psVar17 = (sqlite3_tokenizer_module *)sqlite3Malloc(lVar30 * 0x10 + (ulong)uVar8 * 0x28);
        pCsr = local_d8;
        if (psVar17 != (sqlite3_tokenizer_module *)0x0) {
          pFVar25 = (Fts3TokenAndCost *)((long)&psVar17->iVersion + (ulong)uVar8 * 5 * 8);
          local_a8 = psVar17;
          local_a0 = pFVar25;
          fts3EvalTokenCosts(local_d8,(Fts3Expr *)0x0,local_d8->pExpr,(Fts3TokenAndCost **)&local_a8
                             ,(Fts3Expr ***)&local_a0,(int *)&local_138);
          pFVar4 = local_a0;
          uVar8 = local_138;
          if (local_138 == 0) {
            iVar6 = (int)((ulong)((long)local_a8 - (long)psVar17) >> 3) * -0x33333333;
            uVar8 = fts3EvalSelectDeferred(pCsr,(Fts3Expr *)0x0,(Fts3TokenAndCost *)psVar17,iVar6);
            psVar10 = local_68;
            if ((uVar8 == 0) &&
               (uVar19 = (uint)((ulong)((long)pFVar4 - (long)pFVar25) >> 3), 0 < (int)uVar19)) {
              uVar26 = 1;
              do {
                uVar8 = fts3EvalSelectDeferred
                                  (pCsr,*(Fts3Expr **)((long)pFVar25 + uVar26 * 8 + -8),
                                   (Fts3TokenAndCost *)psVar17,iVar6);
                psVar10 = local_68;
                if (uVar8 != 0) break;
                bVar31 = uVar26 < (uVar19 & 0x7fffffff);
                uVar26 = uVar26 + 1;
              } while (bVar31);
            }
          }
          local_138 = uVar8;
          sqlite3_free(psVar17);
          goto LAB_001b9b19;
        }
      }
      local_138 = 7;
    }
LAB_001b9b19:
    pCursor = &local_d8->base;
    fts3EvalStartReaders(local_d8,local_d8->pExpr,(int *)&local_138);
    psVar3 = local_78;
    uVar8 = local_138;
    sqlite3_blob_close((sqlite3_blob *)local_78[0x13].zErrMsg);
    psVar3[0x13].zErrMsg = (char *)0x0;
    if (uVar8 != 0) {
      return uVar8;
    }
    ((Fts3Cursor *)pCursor)->pNextId = ((Fts3Cursor *)pCursor)->aDoclist;
    ((Fts3Cursor *)pCursor)->iPrevId = 0;
    idxNum = local_5c;
  }
  psVar3 = local_78;
  if ((short)idxNum == 1) {
    iVar6 = fts3CursorSeekStmt((Fts3Cursor *)pCursor);
    if (iVar6 != 0) {
      return iVar6;
    }
    iVar6 = sqlite3_bind_value(((Fts3Cursor *)pCursor)->pStmt,1,local_98);
  }
  else {
    if ((idxNum & 0xffffU) != 0) goto LAB_001b9c5d;
    local_70 = (sqlite3_value *)((ulong)local_70 | (ulong)psVar10);
    if (local_70 == (sqlite3_value *)0x0) {
      pcVar18 = "DESC";
      if (((Fts3Cursor *)pCursor)->bDesc == '\0') {
        pcVar18 = "ASC";
      }
      pcVar18 = sqlite3_mprintf("SELECT %s ORDER BY rowid %s",local_78[0x12].pModule,pcVar18);
    }
    else {
      pcVar18 = sqlite3_mprintf("SELECT %s WHERE rowid BETWEEN %lld AND %lld ORDER BY rowid %s",
                                local_78[0x12].pModule,((Fts3Cursor *)pCursor)->iMinDocid,
                                ((Fts3Cursor *)pCursor)->iMaxDocid);
    }
    if (pcVar18 == (char *)0x0) {
      return 7;
    }
    iVar6 = sqlite3LockAndPrepare
                      ((sqlite3 *)psVar3[1].pModule,pcVar18,-1,0x81,(Vdbe *)0x0,
                       &((Fts3Cursor *)pCursor)->pStmt,(char **)0x0);
    sqlite3_free(pcVar18);
  }
  if (iVar6 != 0) {
    return iVar6;
  }
LAB_001b9c5d:
  iVar6 = fts3NextMethod(pCursor);
  return iVar6;
}

Assistant:

static int fts3FilterMethod(
  sqlite3_vtab_cursor *pCursor,   /* The cursor used for this query */
  int idxNum,                     /* Strategy index */
  const char *idxStr,             /* Unused */
  int nVal,                       /* Number of elements in apVal */
  sqlite3_value **apVal           /* Arguments for the indexing scheme */
){
  int rc = SQLITE_OK;
  char *zSql;                     /* SQL statement used to access %_content */
  int eSearch;
  Fts3Table *p = (Fts3Table *)pCursor->pVtab;
  Fts3Cursor *pCsr = (Fts3Cursor *)pCursor;

  sqlite3_value *pCons = 0;       /* The MATCH or rowid constraint, if any */
  sqlite3_value *pLangid = 0;     /* The "langid = ?" constraint, if any */
  sqlite3_value *pDocidGe = 0;    /* The "docid >= ?" constraint, if any */
  sqlite3_value *pDocidLe = 0;    /* The "docid <= ?" constraint, if any */
  int iIdx;

  UNUSED_PARAMETER(idxStr);
  UNUSED_PARAMETER(nVal);

  eSearch = (idxNum & 0x0000FFFF);
  assert( eSearch>=0 && eSearch<=(FTS3_FULLTEXT_SEARCH+p->nColumn) );
  assert( p->pSegments==0 );

  /* Collect arguments into local variables */
  iIdx = 0;
  if( eSearch!=FTS3_FULLSCAN_SEARCH ) pCons = apVal[iIdx++];
  if( idxNum & FTS3_HAVE_LANGID ) pLangid = apVal[iIdx++];
  if( idxNum & FTS3_HAVE_DOCID_GE ) pDocidGe = apVal[iIdx++];
  if( idxNum & FTS3_HAVE_DOCID_LE ) pDocidLe = apVal[iIdx++];
  assert( iIdx==nVal );

  /* In case the cursor has been used before, clear it now. */
  fts3ClearCursor(pCsr);

  /* Set the lower and upper bounds on docids to return */
  pCsr->iMinDocid = fts3DocidRange(pDocidGe, SMALLEST_INT64);
  pCsr->iMaxDocid = fts3DocidRange(pDocidLe, LARGEST_INT64);

  if( idxStr ){
    pCsr->bDesc = (idxStr[0]=='D');
  }else{
    pCsr->bDesc = p->bDescIdx;
  }
  pCsr->eSearch = (i16)eSearch;

  if( eSearch!=FTS3_DOCID_SEARCH && eSearch!=FTS3_FULLSCAN_SEARCH ){
    int iCol = eSearch-FTS3_FULLTEXT_SEARCH;
    const char *zQuery = (const char *)sqlite3_value_text(pCons);

    if( zQuery==0 && sqlite3_value_type(pCons)!=SQLITE_NULL ){
      return SQLITE_NOMEM;
    }

    pCsr->iLangid = 0;
    if( pLangid ) pCsr->iLangid = sqlite3_value_int(pLangid);

    assert( p->base.zErrMsg==0 );
    rc = sqlite3Fts3ExprParse(p->pTokenizer, pCsr->iLangid,
        p->azColumn, p->bFts4, p->nColumn, iCol, zQuery, -1, &pCsr->pExpr, 
        &p->base.zErrMsg
    );
    if( rc!=SQLITE_OK ){
      return rc;
    }

    rc = fts3EvalStart(pCsr);
    sqlite3Fts3SegmentsClose(p);
    if( rc!=SQLITE_OK ) return rc;
    pCsr->pNextId = pCsr->aDoclist;
    pCsr->iPrevId = 0;
  }

  /* Compile a SELECT statement for this cursor. For a full-table-scan, the
  ** statement loops through all rows of the %_content table. For a
  ** full-text query or docid lookup, the statement retrieves a single
  ** row by docid.
  */
  if( eSearch==FTS3_FULLSCAN_SEARCH ){
    if( pDocidGe || pDocidLe ){
      zSql = sqlite3_mprintf(
          "SELECT %s WHERE rowid BETWEEN %lld AND %lld ORDER BY rowid %s",
          p->zReadExprlist, pCsr->iMinDocid, pCsr->iMaxDocid,
          (pCsr->bDesc ? "DESC" : "ASC")
      );
    }else{
      zSql = sqlite3_mprintf("SELECT %s ORDER BY rowid %s", 
          p->zReadExprlist, (pCsr->bDesc ? "DESC" : "ASC")
      );
    }
    if( zSql ){
      rc = sqlite3_prepare_v3(p->db,zSql,-1,SQLITE_PREPARE_PERSISTENT,&pCsr->pStmt,0);
      sqlite3_free(zSql);
    }else{
      rc = SQLITE_NOMEM;
    }
  }else if( eSearch==FTS3_DOCID_SEARCH ){
    rc = fts3CursorSeekStmt(pCsr);
    if( rc==SQLITE_OK ){
      rc = sqlite3_bind_value(pCsr->pStmt, 1, pCons);
    }
  }
  if( rc!=SQLITE_OK ) return rc;

  return fts3NextMethod(pCursor);
}